

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void uS::Socket::ssl_io_cb<uWS::WebSocket<false>>(uv_poll_t *p,int status,int events)

{
  uv_poll_t *puVar1;
  bool bVar2;
  int iVar3;
  uv_poll_cb p_Var4;
  uint in_EDX;
  int in_ESI;
  uv_poll_t *in_RDI;
  int length;
  int sent;
  Message *messagePtr;
  SSL *ssl;
  NodeData *nodeData;
  SocketData *socketData;
  int in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  bool bVar5;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff54;
  uv_poll_t *in_stack_ffffffffffffff58;
  Socket in_stack_ffffffffffffff60;
  Socket local_98;
  Socket local_90;
  Socket local_88;
  Socket local_80;
  int local_74;
  Socket local_70;
  Socket local_68;
  Socket local_60;
  Socket local_58;
  int local_4c;
  Message *local_48;
  Socket local_40;
  Socket local_38;
  SSL *local_30;
  NodeData *local_28;
  Socket local_20;
  SocketData *local_18;
  uint local_10;
  int local_c;
  uv_poll_t *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Socket(&local_20,in_RDI);
  local_18 = getSocketData(&local_20);
  local_28 = local_18->nodeData;
  local_30 = (SSL *)local_18->ssl;
  if (local_c < 0) {
    Socket(&local_38,local_8);
    uWS::WebSocket<false>::onEnd(in_stack_ffffffffffffff60);
  }
  else {
    bVar2 = SocketData::Queue::empty(&local_18->messageQueue);
    if ((!bVar2) && (((local_10 & 2) != 0 || (iVar3 = SSL_want((SSL *)local_18->ssl), iVar3 == 3))))
    {
      Socket(&local_40,local_8);
      cork((Socket *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
           in_stack_ffffffffffffff2c);
      do {
        while( true ) {
          local_48 = SocketData::Queue::front(&local_18->messageQueue);
          local_4c = SSL_write((SSL *)local_18->ssl,local_48->data,(int)local_48->length);
          if ((long)local_4c != local_48->length) break;
          if (local_48->callback != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
            (*local_48->callback)(local_8,local_48->callbackData,false,local_48->reserved);
          }
          SocketData::Queue::pop
                    ((Queue *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          bVar2 = SocketData::Queue::empty(&local_18->messageQueue);
          if (bVar2) {
            if (((local_18->poll & 2U) != 0) && (iVar3 = SSL_want((SSL *)local_18->ssl), iVar3 != 2)
               ) {
              local_18->poll = 1;
              in_stack_ffffffffffffff58 = local_8;
              Socket(&local_58,local_8);
              p_Var4 = getPollCallback(&local_58);
              uv_poll_start(in_stack_ffffffffffffff58,1,p_Var4);
            }
            goto LAB_001393f2;
          }
        }
      } while (0 < local_4c);
      in_stack_ffffffffffffff54 = SSL_get_error((SSL *)local_18->ssl,local_4c);
      puVar1 = local_8;
      if (in_stack_ffffffffffffff54 != 2) {
        if (in_stack_ffffffffffffff54 != 3) {
          Socket(&local_68,local_8);
          uWS::WebSocket<false>::onEnd(in_stack_ffffffffffffff60);
          return;
        }
        if ((local_18->poll & 2U) == 0) {
          local_18->poll = local_18->poll | 2;
          iVar3 = local_18->poll;
          Socket(&local_60,local_8);
          p_Var4 = getPollCallback(&local_60);
          uv_poll_start(puVar1,iVar3,p_Var4);
        }
      }
LAB_001393f2:
      Socket(&local_70,local_8);
      cork((Socket *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
           in_stack_ffffffffffffff2c);
    }
    if ((local_10 & 1) != 0) {
      while (local_74 = SSL_read(local_30,local_28->recvBuffer,local_28->recvLength), 0 < local_74)
      {
        Socket(&local_90,local_8);
        uWS::WebSocket<false>::onData
                  (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff54);
        Socket(&local_98,local_8);
        bVar2 = isClosed((Socket *)0x139563);
        bVar5 = true;
        if (!bVar2) {
          Socket((Socket *)&stack0xffffffffffffff60,local_8);
          bVar5 = isShuttingDown((Socket *)0x13958c);
        }
        if (bVar5 != false) {
          return;
        }
        iVar3 = SSL_pending(local_30);
        if (iVar3 == 0) {
          return;
        }
      }
      iVar3 = SSL_get_error(local_30,local_74);
      if (iVar3 != 2) {
        if (iVar3 == 3) {
          if ((local_18->poll & 2U) == 0) {
            local_18->poll = local_18->poll | 2;
            iVar3 = local_18->poll;
            Socket(&local_80,local_8);
            p_Var4 = getPollCallback(&local_80);
            uv_poll_start(local_8,iVar3,p_Var4);
          }
        }
        else {
          Socket(&local_88,local_8);
          uWS::WebSocket<false>::onEnd(in_stack_ffffffffffffff60);
        }
      }
    }
  }
  return;
}

Assistant:

static void ssl_io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;
        SSL *ssl = socketData->ssl;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (!socketData->messageQueue.empty() && ((events & UV_WRITABLE) || SSL_want(socketData->ssl) == SSL_READING)) {
            Socket(p).cork(true);
            while (true) {
                SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                int sent = SSL_write(socketData->ssl, messagePtr->data, messagePtr->length);
                if (sent == (ssize_t) messagePtr->length) {
                    if (messagePtr->callback) {
                        messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                    }
                    socketData->messageQueue.pop();
                    if (socketData->messageQueue.empty()) {
                        if ((socketData->poll & UV_WRITABLE) && SSL_want(socketData->ssl) != SSL_WRITING) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                        }
                        break;
                    }
                } else if (sent <= 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                }
            }
            Socket(p).cork(false);
        }

        if (events & UV_READABLE) {
            do {
                int length = SSL_read(ssl, nodeData->recvBuffer, nodeData->recvLength);
                if (length <= 0) {
                    switch (SSL_get_error(ssl, length)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                } else {
                    STATE::onData(p, nodeData->recvBuffer, length);
                    if (Socket(p).isClosed() || Socket(p).isShuttingDown()) {
                        return;
                    }
                }
            } while (SSL_pending(ssl));
        }
    }